

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PreAndPostIncOperatorCheck::throwIfVariableFound
          (PreAndPostIncOperatorCheck *this,VariableList *list,VariableRef *v)

{
  bool bVar1;
  CompileMessage CStack_48;
  
  bVar1 = contains<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,16ul>,soul::pool_ref<soul::AST::VariableDeclaration>&>
                    (list,&v->variable);
  if (!bVar1) {
    return;
  }
  Errors::preIncDecCollision<>();
  AST::Context::throwError
            (&(v->super_Expression).super_Statement.super_ASTObject.context,&CStack_48,false);
}

Assistant:

void throwIfVariableFound (VariableList& list, AST::VariableRef& v)
        {
            if (contains (list, v.variable))
                v.context.throwError (Errors::preIncDecCollision());
        }